

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhTransferCell(lhcell *pTarget,lhpage *pPage)

{
  int iVar1;
  sxu16 local_2a;
  int rc;
  sxu16 nOfft;
  lhcell *pCell;
  lhpage *pPage_local;
  lhcell *pTarget_local;
  
  pCell = (lhcell *)pPage;
  pPage_local = (lhpage *)pTarget;
  iVar1 = lhAllocateSpace(pPage,0x1a,&local_2a);
  if ((iVar1 == 0) ||
     (pTarget_local._4_4_ = lhFindSlavePage((lhpage *)pCell,0x1a,&local_2a,(lhpage **)&pCell),
     pTarget_local._4_4_ == 0)) {
    _rc = lhNewCell(*(lhash_kv_engine **)pCell,(lhpage *)pCell);
    if (_rc == (lhcell *)0x0) {
      pTarget_local._4_4_ = -1;
    }
    else {
      _rc->iStart = local_2a;
      _rc->nData = (sxu64)pPage_local->pRaw;
      _rc->nKey = *(sxu32 *)((long)&pPage_local->pHash + 4);
      _rc->iOvfl = (pPage_local->sHdr).iSlave;
      _rc->iDataOfft = (sxu16)pPage_local->nCell;
      _rc->iDataPage = (pgno)pPage_local->pFirst;
      _rc->nHash = *(sxu32 *)&pPage_local->pHash;
      SyBlobDup((SyBlob *)&pPage_local->pMaster,&_rc->sKey);
      pTarget_local._4_4_ = lhInstallCell(_rc);
      if (pTarget_local._4_4_ == 0) {
        lhCellWriteHeader(_rc);
        pTarget_local._4_4_ = 0;
      }
    }
  }
  return pTarget_local._4_4_;
}

Assistant:

static int lhTransferCell(lhcell *pTarget,lhpage *pPage)
{
	lhcell *pCell;
	sxu16 nOfft;
	int rc;
	/* Check for a free block to hold a single cell only */
	rc = lhAllocateSpace(pPage,L_HASH_CELL_SZ,&nOfft);
	if( rc != UNQLITE_OK ){
		/* Store in a slave page */
		rc = lhFindSlavePage(pPage,L_HASH_CELL_SZ,&nOfft,&pPage);
		if( rc != UNQLITE_OK ){
			return rc;
		}
	}
	/* Allocate a new cell instance */
	pCell = lhNewCell(pPage->pHash,pPage);
	if( pCell == 0 ){
		return UNQLITE_NOMEM;
	}
	/* Fill-in the structure */
	pCell->iStart = nOfft;
	pCell->nData  = pTarget->nData;
	pCell->nKey   = pTarget->nKey;
	pCell->iOvfl  = pTarget->iOvfl;
	pCell->iDataOfft = pTarget->iDataOfft;
	pCell->iDataPage = pTarget->iDataPage;
	pCell->nHash = pTarget->nHash;
	SyBlobDup(&pTarget->sKey,&pCell->sKey);
	/* Link the cell */
	rc = lhInstallCell(pCell);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Finally, Write the cell header */
	lhCellWriteHeader(pCell);
	/* All done */
	return UNQLITE_OK;
}